

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  ErrState *pEVar6;
  ulong **ppuVar7;
  ulong *puVar8;
  int iVar9;
  __PHYSFS_DIRHANDLE__ *h;
  char *dst;
  bool bVar10;
  ulong *local_48 [2];
  char *arcfname;
  
  ppuVar7 = local_48;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    *(undefined4 *)&stat->createtime = 0xffffffff;
    *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
    *(undefined4 *)&stat->accesstime = 0xffffffff;
    *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
    *(undefined4 *)&stat->filesize = 0xffffffff;
    *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
    *(undefined4 *)&stat->modtime = 0xffffffff;
    *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;
    __PHYSFS_platformGrabMutex(stateLock);
    sVar5 = strlen(_fname);
    if (sVar5 + longest_root + 1 < 0x100) {
      local_48[0] = (ulong *)((long)local_48 - (longest_root + sVar5 + 0x18 & 0xfffffffffffffff0));
      ppuVar7 = (ulong **)local_48[0];
    }
    else {
      local_48[0] = (ulong *)0x0;
    }
    bVar10 = local_48[0] == (ulong *)0x0;
    if (bVar10) {
      ppuVar7[-1] = (ulong *)0x1094bf;
      local_48[0] = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar5 + 9);
    }
    if (local_48[0] == (ulong *)0x0) {
      local_48[0] = (ulong *)0x0;
    }
    else {
      *local_48[0] = (ulong)bVar10;
      local_48[0] = local_48[0] + 1;
    }
    if (local_48[0] != (ulong *)0x0) {
      dst = (char *)(longest_root + (long)local_48[0]);
      ppuVar7[-1] = (ulong *)0x1094f4;
      iVar4 = sanitizePlatformIndependentPath(_fname,dst);
      iVar9 = 0;
      if (iVar4 != 0) {
        if (*dst == '\0') {
          stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
          stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
          iVar9 = 1;
        }
        else {
          arcfname = (char *)stat;
          if (searchPath != (DirHandle *)0x0) {
            iVar9 = 0;
            h = searchPath;
            do {
              local_48[1] = (ulong *)dst;
              ppuVar7[-1] = (ulong *)0x10952f;
              iVar4 = partOfMountPoint(h,dst);
              if (iVar4 == 0) {
                ppuVar7[-1] = (ulong *)0x10955e;
                iVar4 = verifyPath(h,(char **)(local_48 + 1),0);
                pcVar3 = arcfname;
                puVar8 = local_48[1];
                bVar10 = true;
                if (iVar4 != 0) {
                  pvVar1 = h->opaque;
                  p_Var2 = h->funcs->stat;
                  ppuVar7[-1] = (ulong *)0x109578;
                  iVar4 = (*p_Var2)(pvVar1,(char *)puVar8,(PHYSFS_Stat *)pcVar3);
                  if (iVar4 == 0) {
                    ppuVar7[-1] = (ulong *)0x109599;
                    pEVar6 = findErrorForCurrentThread();
                    if ((pEVar6 != (ErrState *)0x0) &&
                       (iVar9 = 0, pEVar6->code == PHYSFS_ERR_NOT_FOUND)) goto LAB_00109584;
                  }
                  bVar10 = false;
                  iVar9 = iVar4;
                }
              }
              else {
                arcfname[0x20] = '\x01';
                arcfname[0x21] = '\0';
                arcfname[0x22] = '\0';
                arcfname[0x23] = '\0';
                arcfname[0x24] = '\x01';
                arcfname[0x25] = '\0';
                arcfname[0x26] = '\0';
                arcfname[0x27] = '\0';
                bVar10 = false;
                iVar9 = 1;
              }
LAB_00109584:
            } while ((bVar10) && (h = h->next, h != (__PHYSFS_DIRHANDLE__ *)0x0));
          }
        }
      }
      ppuVar7[-1] = (ulong *)0x1095ef;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (local_48[0][-1] == 0) {
        return iVar9;
      }
      puVar8 = local_48[0] + -1;
      ppuVar7[-1] = (ulong *)0x109608;
      (*__PHYSFS_AllocatorHooks.Free)(puVar8);
      return iVar9;
    }
    ppuVar7[-1] = (ulong *)0x1095b3;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    ppuVar7[-1] = (ulong *)0x1095bf;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return 0;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
        } /* else */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);

    return retval;
}